

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<double>_>::MultAdd
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  undefined8 uVar1;
  complex<double> beta_00;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  complex<double> *pcVar5;
  int c;
  int i;
  int iVar6;
  ulong uVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  int i_1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  complex<double> alpha_00;
  complex<double> alpha_01;
  complex<double> beta_01;
  TPZFMatrix<std::complex<double>_> tempfine;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  uVar10 = alpha._M_value._8_8_;
  uVar9 = alpha._M_value._0_8_;
  alpha_00._M_value._0_4_ = alpha._M_value._0_4_;
  if (alpha_00._M_value._0_4_ == 0) {
    lVar3 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  }
  else {
    lVar3 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  }
  if (lVar3 != (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>",(char *)0x0);
  }
  lVar3 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  if ((lVar3 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) ||
     (lVar3 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  beta_01._M_value._4_4_ = 0;
  beta_01._M_value._0_4_ = alpha_00._M_value._0_4_;
  beta_01._M_value._8_8_ = uVar9;
  uVar9 = in_XMM3_Qa;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<double>_>,y,z,beta_01,(int)uVar10);
  uVar7 = (ulong)*(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                          field_0x1c;
  if (uVar7 == 1) {
    alpha_00._M_value._4_4_ = 0;
    alpha_00._M_value._8_8_ = uVar10;
    MultAddScalar(this,x,y,z,alpha_00,beta,opt);
    return;
  }
  uVar4 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  uVar2 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow / (long)uVar7;
  lVar3 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol / (long)uVar7;
  iVar8 = (int)uVar4;
  iVar6 = (int)uVar2;
  iVar11 = 0;
  uVar12 = 0;
  if (0 < iVar8) {
    uVar12 = uVar4 & 0xffffffff;
  }
  uVar4 = 0;
  if (0 < iVar6) {
    uVar4 = uVar2 & 0xffffffff;
  }
  for (; iVar11 < (int)uVar7; iVar11 = iVar11 + 1) {
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&local_c0,(long)(int)lVar3,(long)iVar8);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&local_150,(long)iVar6,(long)iVar8);
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      for (uVar2 = 0; uVar12 != uVar2; uVar2 = uVar2 + 1) {
        (*(x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])
                  (x,(long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>).
                                     super_TPZBaseMatrix.field_0x1c * (int)uVar7 + iVar11),uVar2);
        uVar9 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        in_XMM2_Qa = in_XMM3_Qa;
        pcVar5 = TPZFMatrix<std::complex<double>_>::operator()(&local_c0,uVar7,uVar2);
        *(undefined8 *)pcVar5->_M_value = uVar9;
        *(undefined8 *)(pcVar5->_M_value + 8) = in_XMM2_Qa;
      }
    }
    alpha_01._M_value._4_4_ = 0;
    alpha_01._M_value._0_4_ = alpha_00._M_value._0_4_;
    beta_00._M_value._8_8_ = x;
    beta_00._M_value._0_8_ = in_XMM2_Qa;
    alpha_01._M_value._8_8_ = uVar10;
    in_XMM3_Qa = in_XMM1_Qa;
    MultAddScalar(this,&local_c0,&local_150,&local_150,alpha_01,beta_00,(int)uVar9);
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      for (uVar2 = 0; uVar12 != uVar2; uVar2 = uVar2 + 1) {
        uVar9 = *(undefined8 *)
                 local_150.fElem
                 [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * uVar2
                  + uVar7]._M_value;
        uVar1 = *(undefined8 *)
                 (local_150.fElem
                  [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * uVar2
                   + uVar7]._M_value + 8);
        pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                           (z,(long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>).
                                              super_TPZBaseMatrix.field_0x1c * (int)uVar7 + iVar11),
                            uVar2);
        *(undefined8 *)pcVar5->_M_value = uVar9;
        *(undefined8 *)(pcVar5->_M_value + 8) = uVar1;
      }
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
    uVar7 = (ulong)*(uint *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             field_0x1c;
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                      TVar alpha, TVar beta, int opt) const{
    // multiplies the transfer matrix and puts the result in z
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
        this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
    if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
        this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
    }
    int rows = fRowBlock.MaxBlockSize();
    int xcols = x.Cols();
    int ic, c, r;
    this->PrepareZ(y,z,beta,opt);
    if (fNTVarVar == 1) {
        MultAddScalar(x, y, z, alpha, beta, opt);
    }
    else
    {
        int nrc = x.Rows();
        int ncc = x.Cols();
        int thisr = this->Rows()/fNTVarVar;
        int thisc = this->Cols()/fNTVarVar;
        for(int iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncc);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    tempcoarse(i,c) = x.GetVal(iv+i*fNTVarVar,c);
                }
            }
            MultAddScalar(tempcoarse, tempfine, tempfine, alpha, 0., opt);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    z(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                }
            }
        }
    }
}